

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall cpptempl::TokenVar::gettext(TokenVar *this,ostream *stream,data_map *data)

{
  Data *pDVar1;
  ostream *in_RSI;
  long in_RDI;
  data_map *in_stack_000000d0;
  string *in_stack_000000d8;
  string local_70 [56];
  string local_38 [56];
  
  std::__cxx11::string::string(local_70,(string *)(in_RDI + 8));
  parse_val(in_stack_000000d8,in_stack_000000d0);
  pDVar1 = data_ptr::operator->((data_ptr *)0x1ea5ca);
  (*pDVar1->_vptr_Data[1])(local_38);
  std::operator<<(in_RSI,local_38);
  std::__cxx11::string::~string(local_38);
  data_ptr::~data_ptr((data_ptr *)0x1ea609);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

inline void TokenVar::gettext( std::ostream &stream, data_map &data )
    {
        stream << parse_val(m_key, data)->getvalue() ;
    }